

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.c
# Opt level: O0

void sendMTFValues(EState *s)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  UChar UVar52;
  EState *pEVar53;
  EState *in_RDI;
  Int32 *s_code_sel_selCtr;
  UChar *s_len_sel_selCtr;
  UInt16 mtfv_i;
  Int32 curr;
  Bool inUse16 [16];
  UChar tmp;
  UChar tmp2;
  UChar ll_i;
  UChar pos [6];
  UInt16 icv_1;
  UInt16 icv;
  UInt32 cost45;
  UInt32 cost23;
  UInt32 cost01;
  Int32 aFreq;
  Int32 tFreq;
  Int32 remF;
  Int32 nPart;
  UInt16 *mtfv;
  Int32 fave [6];
  UInt16 cost [6];
  Int32 nBytes;
  Int32 nGroups;
  Int32 selCtr;
  Int32 maxLen;
  Int32 minLen;
  Int32 alphaSize;
  Int32 nSelectors;
  Int32 iter;
  Int32 bc;
  Int32 bt;
  Int32 totc;
  Int32 ge;
  Int32 gs;
  Int32 j;
  Int32 i;
  Int32 t;
  Int32 v;
  Int32 in_stack_000013a0;
  Int32 in_stack_000013a4;
  Int32 *in_stack_000013a8;
  UChar *in_stack_000013b0;
  uint local_cc;
  char acStack_c8 [31];
  UChar local_a9;
  UChar local_a8;
  UChar local_a7;
  UChar local_a6 [6];
  ushort local_a0;
  ushort local_9e;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  UInt32 local_84;
  UInt16 *local_80;
  int aiStack_78 [8];
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  Int32 local_4c;
  UInt32 local_48;
  UInt32 local_44;
  uint local_40;
  uint local_3c;
  int local_38;
  UInt32 local_34;
  int local_30;
  uint local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  EState *local_8;
  
  local_80 = in_RDI->mtfv;
  local_38 = in_RDI->nInUse + 2;
  for (local_10 = 0; local_10 < 6; local_10 = local_10 + 1) {
    for (local_c = 0; local_c < local_38; local_c = local_c + 1) {
      in_RDI->len[local_10][local_c] = '\x0f';
    }
  }
  local_8 = in_RDI;
  if (in_RDI->nMTF < 1) {
    bz_internal_error(0xbb9);
  }
  if (local_8->nMTF < 200) {
    local_48 = 2;
  }
  else if (local_8->nMTF < 600) {
    local_48 = 3;
  }
  else if (local_8->nMTF < 0x4b0) {
    local_48 = 4;
  }
  else if (local_8->nMTF < 0x960) {
    local_48 = 5;
  }
  else {
    local_48 = 6;
  }
  local_84 = local_48;
  local_88 = local_8->nMTF;
  local_1c = 0;
  for (; 0 < (int)local_84; local_84 = local_84 - 1) {
    local_8c = local_88 / (int)local_84;
    local_20 = local_1c + -1;
    for (local_90 = 0; local_90 < local_88 / (int)local_84 && local_20 < local_38 + -1;
        local_90 = local_8->mtfFreq[local_20] + local_90) {
      local_20 = local_20 + 1;
    }
    if ((((local_1c < local_20) && (local_84 != local_48)) && (local_84 != 1)) &&
       ((int)(local_48 - local_84) % 2 == 1)) {
      local_90 = local_90 - local_8->mtfFreq[local_20];
      local_20 = local_20 + -1;
    }
    for (local_c = 0; local_c < local_38; local_c = local_c + 1) {
      if ((local_c < local_1c) || (local_20 < local_c)) {
        local_8->len[(int)(local_84 - 1)][local_c] = '\x0f';
      }
      else {
        local_8->len[(int)(local_84 - 1)][local_c] = '\0';
      }
    }
    local_1c = local_20 + 1;
    local_88 = local_88 - local_90;
  }
  for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
    for (local_10 = 0; local_10 < (int)local_48; local_10 = local_10 + 1) {
      aiStack_78[local_10] = 0;
    }
    for (local_10 = 0; local_10 < (int)local_48; local_10 = local_10 + 1) {
      for (local_c = 0; local_c < local_38; local_c = local_c + 1) {
        local_8->rfreq[local_10][local_c] = 0;
      }
    }
    if (local_48 == 6) {
      for (local_c = 0; local_c < local_38; local_c = local_c + 1) {
        local_8->len_pack[local_c][0] =
             (uint)local_8->len[1][local_c] << 0x10 | (uint)local_8->len[0][local_c];
        local_8->len_pack[local_c][1] =
             (uint)local_8->len[3][local_c] << 0x10 | (uint)local_8->len[2][local_c];
        local_8->len_pack[local_c][2] =
             (uint)local_8->len[5][local_c] << 0x10 | (uint)local_8->len[4][local_c];
      }
    }
    local_34 = 0;
    local_24 = 0;
    local_1c = 0;
    while (local_1c < local_8->nMTF) {
      local_20 = local_1c + 0x31;
      if (local_8->nMTF <= local_1c + 0x31) {
        local_20 = local_8->nMTF + -1;
      }
      for (local_10 = 0; local_10 < (int)local_48; local_10 = local_10 + 1) {
        *(undefined2 *)((long)&local_58 + (long)local_10 * 2) = 0;
      }
      if ((local_48 == 6) && (local_20 - local_1c == 0x31)) {
        uVar3 = local_80[local_1c];
        uVar4 = local_80[local_1c + 1];
        uVar5 = local_80[local_1c + 2];
        uVar6 = local_80[local_1c + 3];
        uVar7 = local_80[local_1c + 4];
        uVar8 = local_80[local_1c + 5];
        uVar9 = local_80[local_1c + 6];
        uVar10 = local_80[local_1c + 7];
        uVar11 = local_80[local_1c + 8];
        uVar12 = local_80[local_1c + 9];
        uVar13 = local_80[local_1c + 10];
        uVar14 = local_80[local_1c + 0xb];
        uVar15 = local_80[local_1c + 0xc];
        uVar16 = local_80[local_1c + 0xd];
        uVar17 = local_80[local_1c + 0xe];
        uVar18 = local_80[local_1c + 0xf];
        uVar19 = local_80[local_1c + 0x10];
        uVar20 = local_80[local_1c + 0x11];
        uVar21 = local_80[local_1c + 0x12];
        uVar22 = local_80[local_1c + 0x13];
        uVar23 = local_80[local_1c + 0x14];
        uVar24 = local_80[local_1c + 0x15];
        uVar25 = local_80[local_1c + 0x16];
        uVar26 = local_80[local_1c + 0x17];
        uVar27 = local_80[local_1c + 0x18];
        uVar28 = local_80[local_1c + 0x19];
        uVar29 = local_80[local_1c + 0x1a];
        uVar30 = local_80[local_1c + 0x1b];
        uVar31 = local_80[local_1c + 0x1c];
        uVar32 = local_80[local_1c + 0x1d];
        uVar33 = local_80[local_1c + 0x1e];
        uVar34 = local_80[local_1c + 0x1f];
        uVar35 = local_80[local_1c + 0x20];
        uVar36 = local_80[local_1c + 0x21];
        uVar37 = local_80[local_1c + 0x22];
        uVar38 = local_80[local_1c + 0x23];
        uVar39 = local_80[local_1c + 0x24];
        uVar40 = local_80[local_1c + 0x25];
        uVar41 = local_80[local_1c + 0x26];
        uVar42 = local_80[local_1c + 0x27];
        uVar43 = local_80[local_1c + 0x28];
        uVar44 = local_80[local_1c + 0x29];
        uVar45 = local_80[local_1c + 0x2a];
        uVar46 = local_80[local_1c + 0x2b];
        uVar47 = local_80[local_1c + 0x2c];
        uVar48 = local_80[local_1c + 0x2d];
        uVar49 = local_80[local_1c + 0x2e];
        uVar50 = local_80[local_1c + 0x2f];
        uVar51 = local_80[local_1c + 0x30];
        local_9e = local_80[local_1c + 0x31];
        local_58 = local_8->len_pack[local_9e][0] +
                   local_8->len_pack[uVar51][0] +
                   local_8->len_pack[uVar50][0] +
                   local_8->len_pack[uVar49][0] +
                   local_8->len_pack[uVar48][0] +
                   local_8->len_pack[uVar47][0] +
                   local_8->len_pack[uVar46][0] +
                   local_8->len_pack[uVar45][0] +
                   local_8->len_pack[uVar44][0] +
                   local_8->len_pack[uVar43][0] +
                   local_8->len_pack[uVar42][0] +
                   local_8->len_pack[uVar41][0] +
                   local_8->len_pack[uVar40][0] +
                   local_8->len_pack[uVar39][0] +
                   local_8->len_pack[uVar38][0] +
                   local_8->len_pack[uVar37][0] +
                   local_8->len_pack[uVar36][0] +
                   local_8->len_pack[uVar35][0] +
                   local_8->len_pack[uVar34][0] +
                   local_8->len_pack[uVar33][0] +
                   local_8->len_pack[uVar32][0] +
                   local_8->len_pack[uVar31][0] +
                   local_8->len_pack[uVar30][0] +
                   local_8->len_pack[uVar29][0] +
                   local_8->len_pack[uVar28][0] +
                   local_8->len_pack[uVar27][0] +
                   local_8->len_pack[uVar26][0] +
                   local_8->len_pack[uVar25][0] +
                   local_8->len_pack[uVar24][0] +
                   local_8->len_pack[uVar23][0] +
                   local_8->len_pack[uVar22][0] +
                   local_8->len_pack[uVar21][0] +
                   local_8->len_pack[uVar20][0] +
                   local_8->len_pack[uVar19][0] +
                   local_8->len_pack[uVar18][0] +
                   local_8->len_pack[uVar17][0] +
                   local_8->len_pack[uVar16][0] +
                   local_8->len_pack[uVar15][0] +
                   local_8->len_pack[uVar14][0] +
                   local_8->len_pack[uVar13][0] +
                   local_8->len_pack[uVar12][0] +
                   local_8->len_pack[uVar11][0] +
                   local_8->len_pack[uVar10][0] +
                   local_8->len_pack[uVar9][0] +
                   local_8->len_pack[uVar8][0] +
                   local_8->len_pack[uVar7][0] +
                   local_8->len_pack[uVar6][0] +
                   local_8->len_pack[uVar5][0] +
                   local_8->len_pack[uVar4][0] + local_8->len_pack[uVar3][0];
        local_94 = local_58;
        local_54 = local_8->len_pack[local_9e][1] +
                   local_8->len_pack[uVar51][1] +
                   local_8->len_pack[uVar50][1] +
                   local_8->len_pack[uVar49][1] +
                   local_8->len_pack[uVar48][1] +
                   local_8->len_pack[uVar47][1] +
                   local_8->len_pack[uVar46][1] +
                   local_8->len_pack[uVar45][1] +
                   local_8->len_pack[uVar44][1] +
                   local_8->len_pack[uVar43][1] +
                   local_8->len_pack[uVar42][1] +
                   local_8->len_pack[uVar41][1] +
                   local_8->len_pack[uVar40][1] +
                   local_8->len_pack[uVar39][1] +
                   local_8->len_pack[uVar38][1] +
                   local_8->len_pack[uVar37][1] +
                   local_8->len_pack[uVar36][1] +
                   local_8->len_pack[uVar35][1] +
                   local_8->len_pack[uVar34][1] +
                   local_8->len_pack[uVar33][1] +
                   local_8->len_pack[uVar32][1] +
                   local_8->len_pack[uVar31][1] +
                   local_8->len_pack[uVar30][1] +
                   local_8->len_pack[uVar29][1] +
                   local_8->len_pack[uVar28][1] +
                   local_8->len_pack[uVar27][1] +
                   local_8->len_pack[uVar26][1] +
                   local_8->len_pack[uVar25][1] +
                   local_8->len_pack[uVar24][1] +
                   local_8->len_pack[uVar23][1] +
                   local_8->len_pack[uVar22][1] +
                   local_8->len_pack[uVar21][1] +
                   local_8->len_pack[uVar20][1] +
                   local_8->len_pack[uVar19][1] +
                   local_8->len_pack[uVar18][1] +
                   local_8->len_pack[uVar17][1] +
                   local_8->len_pack[uVar16][1] +
                   local_8->len_pack[uVar15][1] +
                   local_8->len_pack[uVar14][1] +
                   local_8->len_pack[uVar13][1] +
                   local_8->len_pack[uVar12][1] +
                   local_8->len_pack[uVar11][1] +
                   local_8->len_pack[uVar10][1] +
                   local_8->len_pack[uVar9][1] +
                   local_8->len_pack[uVar8][1] +
                   local_8->len_pack[uVar7][1] +
                   local_8->len_pack[uVar6][1] +
                   local_8->len_pack[uVar5][1] +
                   local_8->len_pack[uVar4][1] + local_8->len_pack[uVar3][1];
        local_98 = local_54;
        local_50 = local_8->len_pack[local_9e][2] +
                   local_8->len_pack[uVar51][2] +
                   local_8->len_pack[uVar50][2] +
                   local_8->len_pack[uVar49][2] +
                   local_8->len_pack[uVar48][2] +
                   local_8->len_pack[uVar47][2] +
                   local_8->len_pack[uVar46][2] +
                   local_8->len_pack[uVar45][2] +
                   local_8->len_pack[uVar44][2] +
                   local_8->len_pack[uVar43][2] +
                   local_8->len_pack[uVar42][2] +
                   local_8->len_pack[uVar41][2] +
                   local_8->len_pack[uVar40][2] +
                   local_8->len_pack[uVar39][2] +
                   local_8->len_pack[uVar38][2] +
                   local_8->len_pack[uVar37][2] +
                   local_8->len_pack[uVar36][2] +
                   local_8->len_pack[uVar35][2] +
                   local_8->len_pack[uVar34][2] +
                   local_8->len_pack[uVar33][2] +
                   local_8->len_pack[uVar32][2] +
                   local_8->len_pack[uVar31][2] +
                   local_8->len_pack[uVar30][2] +
                   local_8->len_pack[uVar29][2] +
                   local_8->len_pack[uVar28][2] +
                   local_8->len_pack[uVar27][2] +
                   local_8->len_pack[uVar26][2] +
                   local_8->len_pack[uVar25][2] +
                   local_8->len_pack[uVar24][2] +
                   local_8->len_pack[uVar23][2] +
                   local_8->len_pack[uVar22][2] +
                   local_8->len_pack[uVar21][2] +
                   local_8->len_pack[uVar20][2] +
                   local_8->len_pack[uVar19][2] +
                   local_8->len_pack[uVar18][2] +
                   local_8->len_pack[uVar17][2] +
                   local_8->len_pack[uVar16][2] +
                   local_8->len_pack[uVar15][2] +
                   local_8->len_pack[uVar14][2] +
                   local_8->len_pack[uVar13][2] +
                   local_8->len_pack[uVar12][2] +
                   local_8->len_pack[uVar11][2] +
                   local_8->len_pack[uVar10][2] +
                   local_8->len_pack[uVar9][2] +
                   local_8->len_pack[uVar8][2] +
                   local_8->len_pack[uVar7][2] +
                   local_8->len_pack[uVar6][2] +
                   local_8->len_pack[uVar5][2] +
                   local_8->len_pack[uVar4][2] + local_8->len_pack[uVar3][2];
        local_9c = local_50;
      }
      else {
        for (local_14 = local_1c; local_14 <= local_20; local_14 = local_14 + 1) {
          local_a0 = local_80[local_14];
          for (local_10 = 0; local_10 < (int)local_48; local_10 = local_10 + 1) {
            *(ushort *)((long)&local_58 + (long)local_10 * 2) =
                 *(short *)((long)&local_58 + (long)local_10 * 2) +
                 (ushort)local_8->len[local_10][local_a0];
          }
        }
      }
      local_2c = 999999999;
      local_28 = -1;
      for (local_10 = 0; local_10 < (int)local_48; local_10 = local_10 + 1) {
        if (*(ushort *)((long)&local_58 + (long)local_10 * 2) < local_2c) {
          local_2c = (uint)*(ushort *)((long)&local_58 + (long)local_10 * 2);
          local_28 = local_10;
        }
      }
      local_24 = local_2c + local_24;
      aiStack_78[local_28] = aiStack_78[local_28] + 1;
      local_8->selector[(int)local_34] = (UChar)local_28;
      local_34 = local_34 + 1;
      if ((local_48 == 6) && (local_20 - local_1c == 0x31)) {
        local_8->rfreq[local_28][local_80[local_1c]] =
             local_8->rfreq[local_28][local_80[local_1c]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 1]] =
             local_8->rfreq[local_28][local_80[local_1c + 1]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 2]] =
             local_8->rfreq[local_28][local_80[local_1c + 2]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 3]] =
             local_8->rfreq[local_28][local_80[local_1c + 3]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 4]] =
             local_8->rfreq[local_28][local_80[local_1c + 4]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 5]] =
             local_8->rfreq[local_28][local_80[local_1c + 5]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 6]] =
             local_8->rfreq[local_28][local_80[local_1c + 6]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 7]] =
             local_8->rfreq[local_28][local_80[local_1c + 7]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 8]] =
             local_8->rfreq[local_28][local_80[local_1c + 8]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 9]] =
             local_8->rfreq[local_28][local_80[local_1c + 9]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 10]] =
             local_8->rfreq[local_28][local_80[local_1c + 10]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 0xb]] =
             local_8->rfreq[local_28][local_80[local_1c + 0xb]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 0xc]] =
             local_8->rfreq[local_28][local_80[local_1c + 0xc]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 0xd]] =
             local_8->rfreq[local_28][local_80[local_1c + 0xd]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 0xe]] =
             local_8->rfreq[local_28][local_80[local_1c + 0xe]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 0xf]] =
             local_8->rfreq[local_28][local_80[local_1c + 0xf]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 0x10]] =
             local_8->rfreq[local_28][local_80[local_1c + 0x10]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 0x11]] =
             local_8->rfreq[local_28][local_80[local_1c + 0x11]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 0x12]] =
             local_8->rfreq[local_28][local_80[local_1c + 0x12]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 0x13]] =
             local_8->rfreq[local_28][local_80[local_1c + 0x13]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 0x14]] =
             local_8->rfreq[local_28][local_80[local_1c + 0x14]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 0x15]] =
             local_8->rfreq[local_28][local_80[local_1c + 0x15]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 0x16]] =
             local_8->rfreq[local_28][local_80[local_1c + 0x16]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 0x17]] =
             local_8->rfreq[local_28][local_80[local_1c + 0x17]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 0x18]] =
             local_8->rfreq[local_28][local_80[local_1c + 0x18]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 0x19]] =
             local_8->rfreq[local_28][local_80[local_1c + 0x19]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 0x1a]] =
             local_8->rfreq[local_28][local_80[local_1c + 0x1a]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 0x1b]] =
             local_8->rfreq[local_28][local_80[local_1c + 0x1b]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 0x1c]] =
             local_8->rfreq[local_28][local_80[local_1c + 0x1c]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 0x1d]] =
             local_8->rfreq[local_28][local_80[local_1c + 0x1d]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 0x1e]] =
             local_8->rfreq[local_28][local_80[local_1c + 0x1e]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 0x1f]] =
             local_8->rfreq[local_28][local_80[local_1c + 0x1f]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 0x20]] =
             local_8->rfreq[local_28][local_80[local_1c + 0x20]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 0x21]] =
             local_8->rfreq[local_28][local_80[local_1c + 0x21]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 0x22]] =
             local_8->rfreq[local_28][local_80[local_1c + 0x22]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 0x23]] =
             local_8->rfreq[local_28][local_80[local_1c + 0x23]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 0x24]] =
             local_8->rfreq[local_28][local_80[local_1c + 0x24]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 0x25]] =
             local_8->rfreq[local_28][local_80[local_1c + 0x25]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 0x26]] =
             local_8->rfreq[local_28][local_80[local_1c + 0x26]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 0x27]] =
             local_8->rfreq[local_28][local_80[local_1c + 0x27]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 0x28]] =
             local_8->rfreq[local_28][local_80[local_1c + 0x28]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 0x29]] =
             local_8->rfreq[local_28][local_80[local_1c + 0x29]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 0x2a]] =
             local_8->rfreq[local_28][local_80[local_1c + 0x2a]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 0x2b]] =
             local_8->rfreq[local_28][local_80[local_1c + 0x2b]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 0x2c]] =
             local_8->rfreq[local_28][local_80[local_1c + 0x2c]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 0x2d]] =
             local_8->rfreq[local_28][local_80[local_1c + 0x2d]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 0x2e]] =
             local_8->rfreq[local_28][local_80[local_1c + 0x2e]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 0x2f]] =
             local_8->rfreq[local_28][local_80[local_1c + 0x2f]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 0x30]] =
             local_8->rfreq[local_28][local_80[local_1c + 0x30]] + 1;
        local_8->rfreq[local_28][local_80[local_1c + 0x31]] =
             local_8->rfreq[local_28][local_80[local_1c + 0x31]] + 1;
      }
      else {
        for (local_14 = local_1c; local_14 <= local_20; local_14 = local_14 + 1) {
          local_8->rfreq[local_28][local_80[local_14]] =
               local_8->rfreq[local_28][local_80[local_14]] + 1;
        }
      }
      local_1c = local_20 + 1;
    }
    if (2 < local_8->verbosity) {
      for (local_10 = 0; local_10 < (int)local_48; local_10 = local_10 + 1) {
      }
    }
    for (local_10 = 0; local_10 < (int)local_48; local_10 = local_10 + 1) {
      BZ2_hbMakeCodeLengths(in_stack_000013b0,in_stack_000013a8,in_stack_000013a4,in_stack_000013a0)
      ;
    }
  }
  if (7 < (int)local_48) {
    bz_internal_error(0xbba);
  }
  if ((0x7fff < (int)local_34) || (0x4652 < (int)local_34)) {
    bz_internal_error(0xbbb);
  }
  for (local_14 = 0; local_14 < (int)local_48; local_14 = local_14 + 1) {
    local_a6[local_14] = (UChar)local_14;
  }
  for (local_14 = 0; local_14 < (int)local_34; local_14 = local_14 + 1) {
    local_a7 = local_8->selector[local_14];
    local_18 = 0;
    local_a9 = local_a6[0];
    while (UVar52 = local_a9, local_a7 != local_a9) {
      local_18 = local_18 + 1;
      local_a8 = local_a9;
      local_a9 = local_a6[local_18];
      local_a6[local_18] = UVar52;
    }
    local_a6[0] = local_a9;
    local_8->selectorMtf[local_14] = (UChar)local_18;
  }
  for (local_10 = 0; local_10 < (int)local_48; local_10 = local_10 + 1) {
    local_3c = 0x20;
    local_40 = 0;
    for (local_14 = 0; local_14 < local_38; local_14 = local_14 + 1) {
      if (local_40 < local_8->len[local_10][local_14]) {
        local_40 = (uint)local_8->len[local_10][local_14];
      }
      if (local_8->len[local_10][local_14] < local_3c) {
        local_3c = (uint)local_8->len[local_10][local_14];
      }
    }
    if (0x11 < local_40) {
      bz_internal_error(0xbbc);
    }
    if ((int)local_3c < 1) {
      bz_internal_error(0xbbd);
    }
    BZ2_hbAssignCodes(local_8->code[local_10],local_8->len[local_10],local_3c,local_40,local_38);
  }
  for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
    acStack_c8[local_14] = '\0';
    for (local_18 = 0; local_18 < 0x10; local_18 = local_18 + 1) {
      if (local_8->inUse[local_14 * 0x10 + local_18] != '\0') {
        acStack_c8[local_14] = '\x01';
      }
    }
  }
  local_4c = local_8->numZ;
  for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
    if (acStack_c8[local_14] == '\0') {
      bsW(local_8,1,0);
    }
    else {
      bsW(local_8,1,1);
    }
  }
  for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
    if (acStack_c8[local_14] != '\0') {
      for (local_18 = 0; local_18 < 0x10; local_18 = local_18 + 1) {
        if (local_8->inUse[local_14 * 0x10 + local_18] == '\0') {
          bsW(local_8,1,0);
        }
        else {
          bsW(local_8,1,1);
        }
      }
    }
  }
  local_4c = local_8->numZ;
  bsW(local_8,3,local_48);
  bsW(local_8,0xf,local_34);
  for (local_14 = 0; local_14 < (int)local_34; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < (int)(uint)local_8->selectorMtf[local_14]; local_18 = local_18 + 1
        ) {
      bsW(local_8,1,1);
    }
    bsW(local_8,1,0);
  }
  local_4c = local_8->numZ;
  for (local_10 = 0; local_10 < (int)local_48; local_10 = local_10 + 1) {
    local_cc = (uint)local_8->len[local_10][0];
    bsW(local_8,5,local_cc);
    for (local_14 = 0; local_14 < local_38; local_14 = local_14 + 1) {
      for (; (int)local_cc < (int)(uint)local_8->len[local_10][local_14]; local_cc = local_cc + 1) {
        bsW(local_8,2,2);
      }
      for (; (int)(uint)local_8->len[local_10][local_14] < (int)local_cc; local_cc = local_cc - 1) {
        bsW(local_8,2,3);
      }
      bsW(local_8,1,0);
    }
  }
  local_4c = local_8->numZ;
  local_44 = 0;
  local_1c = 0;
  while (local_1c < local_8->nMTF) {
    local_20 = local_1c + 0x31;
    if (local_8->nMTF <= local_20) {
      local_20 = local_8->nMTF + -1;
    }
    if ((int)local_48 <= (int)(uint)local_8->selector[(int)local_44]) {
      bz_internal_error(0xbbe);
    }
    pEVar53 = local_8;
    if ((local_48 == 6) && (local_20 - local_1c == 0x31)) {
      bVar1 = local_8->selector[(int)local_44];
      bVar2 = local_8->selector[(int)local_44];
      bsW(local_8,(uint)local_8->len[bVar1][local_80[local_1c]],
          local_8->code[bVar2][local_80[local_1c]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 1]],
          pEVar53->code[bVar2][local_80[local_1c + 1]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 2]],
          pEVar53->code[bVar2][local_80[local_1c + 2]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 3]],
          pEVar53->code[bVar2][local_80[local_1c + 3]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 4]],
          pEVar53->code[bVar2][local_80[local_1c + 4]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 5]],
          pEVar53->code[bVar2][local_80[local_1c + 5]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 6]],
          pEVar53->code[bVar2][local_80[local_1c + 6]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 7]],
          pEVar53->code[bVar2][local_80[local_1c + 7]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 8]],
          pEVar53->code[bVar2][local_80[local_1c + 8]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 9]],
          pEVar53->code[bVar2][local_80[local_1c + 9]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 10]],
          pEVar53->code[bVar2][local_80[local_1c + 10]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 0xb]],
          pEVar53->code[bVar2][local_80[local_1c + 0xb]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 0xc]],
          pEVar53->code[bVar2][local_80[local_1c + 0xc]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 0xd]],
          pEVar53->code[bVar2][local_80[local_1c + 0xd]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 0xe]],
          pEVar53->code[bVar2][local_80[local_1c + 0xe]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 0xf]],
          pEVar53->code[bVar2][local_80[local_1c + 0xf]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 0x10]],
          pEVar53->code[bVar2][local_80[local_1c + 0x10]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 0x11]],
          pEVar53->code[bVar2][local_80[local_1c + 0x11]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 0x12]],
          pEVar53->code[bVar2][local_80[local_1c + 0x12]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 0x13]],
          pEVar53->code[bVar2][local_80[local_1c + 0x13]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 0x14]],
          pEVar53->code[bVar2][local_80[local_1c + 0x14]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 0x15]],
          pEVar53->code[bVar2][local_80[local_1c + 0x15]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 0x16]],
          pEVar53->code[bVar2][local_80[local_1c + 0x16]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 0x17]],
          pEVar53->code[bVar2][local_80[local_1c + 0x17]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 0x18]],
          pEVar53->code[bVar2][local_80[local_1c + 0x18]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 0x19]],
          pEVar53->code[bVar2][local_80[local_1c + 0x19]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 0x1a]],
          pEVar53->code[bVar2][local_80[local_1c + 0x1a]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 0x1b]],
          pEVar53->code[bVar2][local_80[local_1c + 0x1b]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 0x1c]],
          pEVar53->code[bVar2][local_80[local_1c + 0x1c]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 0x1d]],
          pEVar53->code[bVar2][local_80[local_1c + 0x1d]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 0x1e]],
          pEVar53->code[bVar2][local_80[local_1c + 0x1e]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 0x1f]],
          pEVar53->code[bVar2][local_80[local_1c + 0x1f]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 0x20]],
          pEVar53->code[bVar2][local_80[local_1c + 0x20]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 0x21]],
          pEVar53->code[bVar2][local_80[local_1c + 0x21]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 0x22]],
          pEVar53->code[bVar2][local_80[local_1c + 0x22]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 0x23]],
          pEVar53->code[bVar2][local_80[local_1c + 0x23]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 0x24]],
          pEVar53->code[bVar2][local_80[local_1c + 0x24]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 0x25]],
          pEVar53->code[bVar2][local_80[local_1c + 0x25]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 0x26]],
          pEVar53->code[bVar2][local_80[local_1c + 0x26]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 0x27]],
          pEVar53->code[bVar2][local_80[local_1c + 0x27]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 0x28]],
          pEVar53->code[bVar2][local_80[local_1c + 0x28]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 0x29]],
          pEVar53->code[bVar2][local_80[local_1c + 0x29]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 0x2a]],
          pEVar53->code[bVar2][local_80[local_1c + 0x2a]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 0x2b]],
          pEVar53->code[bVar2][local_80[local_1c + 0x2b]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 0x2c]],
          pEVar53->code[bVar2][local_80[local_1c + 0x2c]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 0x2d]],
          pEVar53->code[bVar2][local_80[local_1c + 0x2d]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 0x2e]],
          pEVar53->code[bVar2][local_80[local_1c + 0x2e]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 0x2f]],
          pEVar53->code[bVar2][local_80[local_1c + 0x2f]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 0x30]],
          pEVar53->code[bVar2][local_80[local_1c + 0x30]]);
      bsW(local_8,(uint)pEVar53->len[bVar1][local_80[local_1c + 0x31]],
          pEVar53->code[bVar2][local_80[local_1c + 0x31]]);
    }
    else {
      for (local_14 = local_1c; local_14 <= local_20; local_14 = local_14 + 1) {
        bsW(local_8,(uint)local_8->len[local_8->selector[(int)local_44]][local_80[local_14]],
            local_8->code[local_8->selector[(int)local_44]][local_80[local_14]]);
      }
    }
    local_44 = local_44 + 1;
    local_1c = local_20 + 1;
  }
  if (local_44 != local_34) {
    bz_internal_error(0xbbf);
  }
  return;
}

Assistant:

static
void sendMTFValues ( EState* s )
{
   Int32 v, t, i, j, gs, ge, totc, bt, bc, iter;
   Int32 nSelectors, alphaSize, minLen, maxLen, selCtr;
   Int32 nGroups, nBytes;

   /*--
   UChar  len [BZ_N_GROUPS][BZ_MAX_ALPHA_SIZE];
   is a global since the decoder also needs it.

   Int32  code[BZ_N_GROUPS][BZ_MAX_ALPHA_SIZE];
   Int32  rfreq[BZ_N_GROUPS][BZ_MAX_ALPHA_SIZE];
   are also globals only used in this proc.
   Made global to keep stack frame size small.
   --*/


   UInt16 cost[BZ_N_GROUPS];
   Int32  fave[BZ_N_GROUPS];

   UInt16* mtfv = s->mtfv;

   if (s->verbosity >= 3)
      VPrintf3( "      %d in block, %d after MTF & 1-2 coding, "
                "%d+2 syms in use\n", 
                s->nblock, s->nMTF, s->nInUse );

   alphaSize = s->nInUse+2;
   for (t = 0; t < BZ_N_GROUPS; t++)
      for (v = 0; v < alphaSize; v++)
         s->len[t][v] = BZ_GREATER_ICOST;

   /*--- Decide how many coding tables to use ---*/
   AssertH ( s->nMTF > 0, 3001 );
   if (s->nMTF < 200)  nGroups = 2; else
   if (s->nMTF < 600)  nGroups = 3; else
   if (s->nMTF < 1200) nGroups = 4; else
   if (s->nMTF < 2400) nGroups = 5; else
                       nGroups = 6;

   /*--- Generate an initial set of coding tables ---*/
   { 
      Int32 nPart, remF, tFreq, aFreq;

      nPart = nGroups;
      remF  = s->nMTF;
      gs = 0;
      while (nPart > 0) {
         tFreq = remF / nPart;
         ge = gs-1;
         aFreq = 0;
         while (aFreq < tFreq && ge < alphaSize-1) {
            ge++;
            aFreq += s->mtfFreq[ge];
         }

         if (ge > gs 
             && nPart != nGroups && nPart != 1 
             && ((nGroups-nPart) % 2 == 1)) {
            aFreq -= s->mtfFreq[ge];
            ge--;
         }

         if (s->verbosity >= 3)
            VPrintf5( "      initial group %d, [%d .. %d], "
                      "has %d syms (%4.1f%%)\n",
                      nPart, gs, ge, aFreq, 
                      (100.0 * (float)aFreq) / (float)(s->nMTF) );
 
         for (v = 0; v < alphaSize; v++)
            if (v >= gs && v <= ge) 
               s->len[nPart-1][v] = BZ_LESSER_ICOST; else
               s->len[nPart-1][v] = BZ_GREATER_ICOST;
 
         nPart--;
         gs = ge+1;
         remF -= aFreq;
      }
   }

   /*--- 
      Iterate up to BZ_N_ITERS times to improve the tables.
   ---*/
   for (iter = 0; iter < BZ_N_ITERS; iter++) {

      for (t = 0; t < nGroups; t++) fave[t] = 0;

      for (t = 0; t < nGroups; t++)
         for (v = 0; v < alphaSize; v++)
            s->rfreq[t][v] = 0;

      /*---
        Set up an auxiliary length table which is used to fast-track
	the common case (nGroups == 6). 
      ---*/
      if (nGroups == 6) {
         for (v = 0; v < alphaSize; v++) {
            s->len_pack[v][0] = (s->len[1][v] << 16) | s->len[0][v];
            s->len_pack[v][1] = (s->len[3][v] << 16) | s->len[2][v];
            s->len_pack[v][2] = (s->len[5][v] << 16) | s->len[4][v];
	 }
      }

      nSelectors = 0;
      totc = 0;
      gs = 0;
      while (True) {

         /*--- Set group start & end marks. --*/
         if (gs >= s->nMTF) break;
         ge = gs + BZ_G_SIZE - 1; 
         if (ge >= s->nMTF) ge = s->nMTF-1;

         /*-- 
            Calculate the cost of this group as coded
            by each of the coding tables.
         --*/
         for (t = 0; t < nGroups; t++) cost[t] = 0;

         if (nGroups == 6 && 50 == ge-gs+1) {
            /*--- fast track the common case ---*/
            register UInt32 cost01, cost23, cost45;
            register UInt16 icv;
            cost01 = cost23 = cost45 = 0;

#           define BZ_ITER(nn)                \
               icv = mtfv[gs+(nn)];           \
               cost01 += s->len_pack[icv][0]; \
               cost23 += s->len_pack[icv][1]; \
               cost45 += s->len_pack[icv][2]; \

            BZ_ITER(0);  BZ_ITER(1);  BZ_ITER(2);  BZ_ITER(3);  BZ_ITER(4);
            BZ_ITER(5);  BZ_ITER(6);  BZ_ITER(7);  BZ_ITER(8);  BZ_ITER(9);
            BZ_ITER(10); BZ_ITER(11); BZ_ITER(12); BZ_ITER(13); BZ_ITER(14);
            BZ_ITER(15); BZ_ITER(16); BZ_ITER(17); BZ_ITER(18); BZ_ITER(19);
            BZ_ITER(20); BZ_ITER(21); BZ_ITER(22); BZ_ITER(23); BZ_ITER(24);
            BZ_ITER(25); BZ_ITER(26); BZ_ITER(27); BZ_ITER(28); BZ_ITER(29);
            BZ_ITER(30); BZ_ITER(31); BZ_ITER(32); BZ_ITER(33); BZ_ITER(34);
            BZ_ITER(35); BZ_ITER(36); BZ_ITER(37); BZ_ITER(38); BZ_ITER(39);
            BZ_ITER(40); BZ_ITER(41); BZ_ITER(42); BZ_ITER(43); BZ_ITER(44);
            BZ_ITER(45); BZ_ITER(46); BZ_ITER(47); BZ_ITER(48); BZ_ITER(49);

#           undef BZ_ITER

            cost[0] = cost01 & 0xffff; cost[1] = cost01 >> 16;
            cost[2] = cost23 & 0xffff; cost[3] = cost23 >> 16;
            cost[4] = cost45 & 0xffff; cost[5] = cost45 >> 16;

         } else {
	    /*--- slow version which correctly handles all situations ---*/
            for (i = gs; i <= ge; i++) { 
               UInt16 icv = mtfv[i];
               for (t = 0; t < nGroups; t++) cost[t] += s->len[t][icv];
            }
         }
 
         /*-- 
            Find the coding table which is best for this group,
            and record its identity in the selector table.
         --*/
         bc = 999999999; bt = -1;
         for (t = 0; t < nGroups; t++)
            if (cost[t] < bc) { bc = cost[t]; bt = t; };
         totc += bc;
         fave[bt]++;
         s->selector[nSelectors] = bt;
         nSelectors++;

         /*-- 
            Increment the symbol frequencies for the selected table.
          --*/
         if (nGroups == 6 && 50 == ge-gs+1) {
            /*--- fast track the common case ---*/

#           define BZ_ITUR(nn) s->rfreq[bt][ mtfv[gs+(nn)] ]++

            BZ_ITUR(0);  BZ_ITUR(1);  BZ_ITUR(2);  BZ_ITUR(3);  BZ_ITUR(4);
            BZ_ITUR(5);  BZ_ITUR(6);  BZ_ITUR(7);  BZ_ITUR(8);  BZ_ITUR(9);
            BZ_ITUR(10); BZ_ITUR(11); BZ_ITUR(12); BZ_ITUR(13); BZ_ITUR(14);
            BZ_ITUR(15); BZ_ITUR(16); BZ_ITUR(17); BZ_ITUR(18); BZ_ITUR(19);
            BZ_ITUR(20); BZ_ITUR(21); BZ_ITUR(22); BZ_ITUR(23); BZ_ITUR(24);
            BZ_ITUR(25); BZ_ITUR(26); BZ_ITUR(27); BZ_ITUR(28); BZ_ITUR(29);
            BZ_ITUR(30); BZ_ITUR(31); BZ_ITUR(32); BZ_ITUR(33); BZ_ITUR(34);
            BZ_ITUR(35); BZ_ITUR(36); BZ_ITUR(37); BZ_ITUR(38); BZ_ITUR(39);
            BZ_ITUR(40); BZ_ITUR(41); BZ_ITUR(42); BZ_ITUR(43); BZ_ITUR(44);
            BZ_ITUR(45); BZ_ITUR(46); BZ_ITUR(47); BZ_ITUR(48); BZ_ITUR(49);

#           undef BZ_ITUR

         } else {
	    /*--- slow version which correctly handles all situations ---*/
            for (i = gs; i <= ge; i++)
               s->rfreq[bt][ mtfv[i] ]++;
         }

         gs = ge+1;
      }
      if (s->verbosity >= 3) {
         VPrintf2 ( "      pass %d: size is %d, grp uses are ", 
                   iter+1, totc/8 );
         for (t = 0; t < nGroups; t++)
            VPrintf1 ( "%d ", fave[t] );
         VPrintf0 ( "\n" );
      }

      /*--
        Recompute the tables based on the accumulated frequencies.
      --*/
      /* maxLen was changed from 20 to 17 in bzip2-1.0.3.  See 
         comment in huffman.c for details. */
      for (t = 0; t < nGroups; t++)
         BZ2_hbMakeCodeLengths ( &(s->len[t][0]), &(s->rfreq[t][0]), 
                                 alphaSize, 17 /*20*/ );
   }


   AssertH( nGroups < 8, 3002 );
   AssertH( nSelectors < 32768 &&
            nSelectors <= (2 + (900000 / BZ_G_SIZE)),
            3003 );


   /*--- Compute MTF values for the selectors. ---*/
   {
      UChar pos[BZ_N_GROUPS], ll_i, tmp2, tmp;
      for (i = 0; i < nGroups; i++) pos[i] = i;
      for (i = 0; i < nSelectors; i++) {
         ll_i = s->selector[i];
         j = 0;
         tmp = pos[j];
         while ( ll_i != tmp ) {
            j++;
            tmp2 = tmp;
            tmp = pos[j];
            pos[j] = tmp2;
         };
         pos[0] = tmp;
         s->selectorMtf[i] = j;
      }
   };

   /*--- Assign actual codes for the tables. --*/
   for (t = 0; t < nGroups; t++) {
      minLen = 32;
      maxLen = 0;
      for (i = 0; i < alphaSize; i++) {
         if (s->len[t][i] > maxLen) maxLen = s->len[t][i];
         if (s->len[t][i] < minLen) minLen = s->len[t][i];
      }
      AssertH ( !(maxLen > 17 /*20*/ ), 3004 );
      AssertH ( !(minLen < 1),  3005 );
      BZ2_hbAssignCodes ( &(s->code[t][0]), &(s->len[t][0]), 
                          minLen, maxLen, alphaSize );
   }

   /*--- Transmit the mapping table. ---*/
   { 
      Bool inUse16[16];
      for (i = 0; i < 16; i++) {
          inUse16[i] = False;
          for (j = 0; j < 16; j++)
             if (s->inUse[i * 16 + j]) inUse16[i] = True;
      }
     
      nBytes = s->numZ;
      for (i = 0; i < 16; i++)
         if (inUse16[i]) bsW(s,1,1); else bsW(s,1,0);

      for (i = 0; i < 16; i++)
         if (inUse16[i])
            for (j = 0; j < 16; j++) {
               if (s->inUse[i * 16 + j]) bsW(s,1,1); else bsW(s,1,0);
            }

      if (s->verbosity >= 3) 
         VPrintf1( "      bytes: mapping %d, ", s->numZ-nBytes );
   }

   /*--- Now the selectors. ---*/
   nBytes = s->numZ;
   bsW ( s, 3, nGroups );
   bsW ( s, 15, nSelectors );
   for (i = 0; i < nSelectors; i++) { 
      for (j = 0; j < s->selectorMtf[i]; j++) bsW(s,1,1);
      bsW(s,1,0);
   }
   if (s->verbosity >= 3)
      VPrintf1( "selectors %d, ", s->numZ-nBytes );

   /*--- Now the coding tables. ---*/
   nBytes = s->numZ;

   for (t = 0; t < nGroups; t++) {
      Int32 curr = s->len[t][0];
      bsW ( s, 5, curr );
      for (i = 0; i < alphaSize; i++) {
         while (curr < s->len[t][i]) { bsW(s,2,2); curr++; /* 10 */ };
         while (curr > s->len[t][i]) { bsW(s,2,3); curr--; /* 11 */ };
         bsW ( s, 1, 0 );
      }
   }

   if (s->verbosity >= 3)
      VPrintf1 ( "code lengths %d, ", s->numZ-nBytes );

   /*--- And finally, the block data proper ---*/
   nBytes = s->numZ;
   selCtr = 0;
   gs = 0;
   while (True) {
      if (gs >= s->nMTF) break;
      ge = gs + BZ_G_SIZE - 1; 
      if (ge >= s->nMTF) ge = s->nMTF-1;
      AssertH ( s->selector[selCtr] < nGroups, 3006 );

      if (nGroups == 6 && 50 == ge-gs+1) {
            /*--- fast track the common case ---*/
            UInt16 mtfv_i;
            UChar* s_len_sel_selCtr 
               = &(s->len[s->selector[selCtr]][0]);
            Int32* s_code_sel_selCtr
               = &(s->code[s->selector[selCtr]][0]);

#           define BZ_ITAH(nn)                      \
               mtfv_i = mtfv[gs+(nn)];              \
               bsW ( s,                             \
                     s_len_sel_selCtr[mtfv_i],      \
                     s_code_sel_selCtr[mtfv_i] )

            BZ_ITAH(0);  BZ_ITAH(1);  BZ_ITAH(2);  BZ_ITAH(3);  BZ_ITAH(4);
            BZ_ITAH(5);  BZ_ITAH(6);  BZ_ITAH(7);  BZ_ITAH(8);  BZ_ITAH(9);
            BZ_ITAH(10); BZ_ITAH(11); BZ_ITAH(12); BZ_ITAH(13); BZ_ITAH(14);
            BZ_ITAH(15); BZ_ITAH(16); BZ_ITAH(17); BZ_ITAH(18); BZ_ITAH(19);
            BZ_ITAH(20); BZ_ITAH(21); BZ_ITAH(22); BZ_ITAH(23); BZ_ITAH(24);
            BZ_ITAH(25); BZ_ITAH(26); BZ_ITAH(27); BZ_ITAH(28); BZ_ITAH(29);
            BZ_ITAH(30); BZ_ITAH(31); BZ_ITAH(32); BZ_ITAH(33); BZ_ITAH(34);
            BZ_ITAH(35); BZ_ITAH(36); BZ_ITAH(37); BZ_ITAH(38); BZ_ITAH(39);
            BZ_ITAH(40); BZ_ITAH(41); BZ_ITAH(42); BZ_ITAH(43); BZ_ITAH(44);
            BZ_ITAH(45); BZ_ITAH(46); BZ_ITAH(47); BZ_ITAH(48); BZ_ITAH(49);

#           undef BZ_ITAH

      } else {
	 /*--- slow version which correctly handles all situations ---*/
         for (i = gs; i <= ge; i++) {
            bsW ( s, 
                  s->len  [s->selector[selCtr]] [mtfv[i]],
                  s->code [s->selector[selCtr]] [mtfv[i]] );
         }
      }


      gs = ge+1;
      selCtr++;
   }
   AssertH( selCtr == nSelectors, 3007 );

   if (s->verbosity >= 3)
      VPrintf1( "codes %d\n", s->numZ-nBytes );
}